

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeIteratorImpl.cpp
# Opt level: O0

DOMNode * __thiscall xercesc_4_0::DOMNodeIteratorImpl::nextNode(DOMNodeIteratorImpl *this)

{
  DOMException *this_00;
  MemoryManager *local_68;
  DOMDocumentImpl *local_58;
  bool local_31;
  DOMNode *pDStack_30;
  bool accepted;
  DOMNode *aNextNode;
  DOMNodeIteratorImpl *this_local;
  
  if ((this->fDetached & 1U) != 0) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fDocument == (DOMDocument *)0x0) {
      local_68 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      if (this->fDocument == (DOMDocument *)0x0) {
        local_58 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_58 = (DOMDocumentImpl *)&this->fDocument[-1].super_DOMNode;
      }
      local_68 = DOMDocumentImpl::getMemoryManager(local_58);
    }
    DOMException::DOMException(this_00,0xb,0,local_68);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  if (this->fRoot == (DOMNode *)0x0) {
    this_local = (DOMNodeIteratorImpl *)0x0;
  }
  else {
    pDStack_30 = this->fCurrentNode;
    local_31 = false;
    do {
      if (((local_31 ^ 0xffU) & 1) == 0) {
        return (DOMNode *)0x0;
      }
      if (((this->fForward & 1U) == 0) && (pDStack_30 != (DOMNode *)0x0)) {
        pDStack_30 = this->fCurrentNode;
      }
      else {
        pDStack_30 = nextNode(this,pDStack_30,true);
      }
      this->fForward = true;
      if (pDStack_30 == (DOMNode *)0x0) {
        return (DOMNode *)0x0;
      }
      local_31 = acceptNode(this,pDStack_30);
    } while (!local_31);
    this->fCurrentNode = pDStack_30;
    this_local = (DOMNodeIteratorImpl *)this->fCurrentNode;
  }
  return (DOMNode *)this_local;
}

Assistant:

DOMNode* DOMNodeIteratorImpl::nextNode () {
	if (fDetached)
		throw DOMException(DOMException::INVALID_STATE_ERR, 0, GetDOMNodeIteratorMemoryManager);

    // if root is 0 there is no next node->
    if (!fRoot)
			return 0;

    DOMNode* aNextNode = fCurrentNode;
    bool accepted = false; // the next node has not been accepted.

    while (!accepted) {

        // if last direction is not forward, repeat node->
        if (!fForward && (aNextNode != 0)) {
            //System.out.println("nextNode():!fForward:"+fCurrentNode.getNodeName());
            aNextNode = fCurrentNode;
        } else {
        // else get the next node via depth-first
            aNextNode = nextNode(aNextNode, true);
        }

        fForward = true; //REVIST: should direction be set forward before 0 check?

        // nothing in the list. return 0.
        if (!aNextNode) return 0;

        // does node pass the filters and whatToShow?
        accepted = acceptNode(aNextNode);
        if (accepted) {
            // if so, then the node is the current node->
            fCurrentNode = aNextNode;
            return fCurrentNode;
        }
    }

    // no nodes, or no accepted nodes.
    return 0;
}